

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void nodeGetCell(Rtree *pRtree,RtreeNode *pNode,int iCell,RtreeCell *pCell)

{
  uint uVar1;
  i64 iVar2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = (long)iCell * (ulong)pRtree->nBytesPerCell;
  iVar2 = readInt64((u8 *)((long)&pNode->pParent + lVar4 + 4));
  pCell->iRowid = iVar2;
  uVar3 = 0;
  do {
    uVar1 = *(uint *)((long)&pNode->iNode + uVar3 * 4 + lVar4 + 4);
    pCell->aCoord[uVar3].u =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)((long)&pNode->nRef + uVar3 * 4 + lVar4);
    pCell->aCoord[uVar3 + 1].u =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar3 = uVar3 + 2;
  } while (uVar3 < pRtree->nDim2);
  return;
}

Assistant:

static void nodeGetCell(
  Rtree *pRtree,               /* The overall R-Tree */
  RtreeNode *pNode,            /* The node containing the cell to be read */
  int iCell,                   /* Index of the cell within the node */
  RtreeCell *pCell             /* OUT: Write the cell contents here */
){
  u8 *pData;
  RtreeCoord *pCoord;
  int ii = 0;
  pCell->iRowid = nodeGetRowid(pRtree, pNode, iCell);
  pData = pNode->zData + (12 + pRtree->nBytesPerCell*iCell);
  pCoord = pCell->aCoord;
  do{
    readCoord(pData, &pCoord[ii]);
    readCoord(pData+4, &pCoord[ii+1]);
    pData += 8;
    ii += 2;
  }while( ii<pRtree->nDim2 );
}